

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_getshortstr_continue(TString *key,Node *n)

{
  byte bVar1;
  TString *pTVar2;
  Node *pNVar3;
  long lVar4;
  char *__assertion;
  
  while( true ) {
    do {
      lVar4 = (long)(n->i_key).nk.next;
      if (lVar4 == 0) {
        return &luaO_nilobject_;
      }
      pNVar3 = n + lVar4;
      n = n + lVar4;
    } while ((pNVar3->i_key).nk.tt_ != 0x8004);
    pTVar2 = (TString *)(n->i_key).nk.value_.gc;
    bVar1 = pTVar2->tt;
    if ((bVar1 & 0xf) != 4) break;
    if (bVar1 != 4) {
      __assertion = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c\", 674, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c\", 674, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_0013865d;
    }
    if (pTVar2 == key) {
      return &n->i_val;
    }
  }
  __assertion = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_0013865d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
}

Assistant:

const TValue *luaH_getshortstr_continue(TString *key, Node *n) {
  for (;;) { /* check whether 'key' is somewhere in the chain starting from next node after n */
    int nx = gnext(n);
    if (nx == 0)
      return luaO_nilobject; /* not found */
    n += nx;
    const TValue *k = gkey(n);
    if (ttisshrstring(k) && eqshrstr(tsvalue(k), key))
      return gval(n); /* that's it */
  }
}